

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int cm_zlib_deflateEnd(z_streamp_conflict strm)

{
  int iVar1;
  internal_state_conflict1 *piVar2;
  Posf *pPVar3;
  Bytef *pBVar4;
  int iVar5;
  
  iVar5 = -2;
  if ((strm != (z_streamp_conflict)0x0) &&
     (piVar2 = strm->state, piVar2 != (internal_state_conflict1 *)0x0)) {
    iVar1 = piVar2->status;
    if (((iVar1 - 0x45U < 0x2d) && ((0x100400400011U >> ((ulong)(iVar1 - 0x45U) & 0x3f) & 1) != 0))
       || ((iVar1 == 0x29a || (iVar1 == 0x2a)))) {
      if (piVar2->pending_buf != (Bytef *)0x0) {
        (*strm->zfree)(strm->opaque,piVar2->pending_buf);
      }
      pPVar3 = strm->state->head;
      if (pPVar3 != (Posf *)0x0) {
        (*strm->zfree)(strm->opaque,pPVar3);
      }
      pPVar3 = strm->state->prev;
      if (pPVar3 != (Posf *)0x0) {
        (*strm->zfree)(strm->opaque,pPVar3);
      }
      pBVar4 = strm->state->window;
      if (pBVar4 != (Bytef *)0x0) {
        (*strm->zfree)(strm->opaque,pBVar4);
      }
      (*strm->zfree)(strm->opaque,strm->state);
      strm->state = (internal_state_conflict1 *)0x0;
      iVar5 = (uint)(iVar1 != 0x71) * 3 + -3;
    }
  }
  return iVar5;
}

Assistant:

int ZEXPORT deflateEnd (strm)
    z_streamp strm;
{
    int status;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;

    status = strm->state->status;
    if (status != INIT_STATE &&
        status != EXTRA_STATE &&
        status != NAME_STATE &&
        status != COMMENT_STATE &&
        status != HCRC_STATE &&
        status != BUSY_STATE &&
        status != FINISH_STATE) {
      return Z_STREAM_ERROR;
    }

    /* Deallocate in reverse order of allocations: */
    TRY_FREE(strm, strm->state->pending_buf);
    TRY_FREE(strm, strm->state->head);
    TRY_FREE(strm, strm->state->prev);
    TRY_FREE(strm, strm->state->window);

    ZFREE(strm, strm->state);
    strm->state = Z_NULL;

    return status == BUSY_STATE ? Z_DATA_ERROR : Z_OK;
}